

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
google::
dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
::set_deleted_key(dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                  *this,key_type *key)

{
  if (((this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
       use_empty_ == true) && (*key == (this->val_info).emptyval.first)) {
    __assert_fail("(!settings.use_empty() || !equals(key, get_key(val_info.emptyval))) && \"Passed the empty-key to set_deleted_key\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/sparsehash/src/sparsehash/internal/densehashtable.h"
                  ,0x18a,
                  "void google::dense_hashtable<std::pair<const char, std::vector<CMString> *>, char, std::hash<char>, google::dense_hash_map<char, std::vector<CMString> *>::SelectKey, google::dense_hash_map<char, std::vector<CMString> *>::SetKey, std::equal_to<char>, google::libc_allocator_with_realloc<std::pair<const char, std::vector<CMString> *>>>::set_deleted_key(const key_type &) [Value = std::pair<const char, std::vector<CMString> *>, Key = char, HashFcn = std::hash<char>, ExtractKey = google::dense_hash_map<char, std::vector<CMString> *>::SelectKey, SetKey = google::dense_hash_map<char, std::vector<CMString> *>::SetKey, EqualKey = std::equal_to<char>, Alloc = google::libc_allocator_with_realloc<std::pair<const char, std::vector<CMString> *>>]"
                 );
  }
  squash_deleted(this);
  (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.use_deleted_
       = true;
  (this->key_info).delkey = *key;
  return;
}

Assistant:

void set_deleted_key(const key_type &key) {
    // the empty indicator (if specified) and the deleted indicator
    // must be different
    assert((!settings.use_empty() || !equals(key, get_key(val_info.emptyval)))
           && "Passed the empty-key to set_deleted_key");
    // It's only safe to change what "deleted" means if we purge deleted guys
    squash_deleted();
    settings.set_use_deleted(true);
    key_info.delkey = key;
  }